

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::ExceptionOr<kj::Array<unsigned_char>_>::~ExceptionOr
          (ExceptionOr<kj::Array<unsigned_char>_> *this)

{
  uchar *puVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  
  if (((this->value).ptr.isSet == true) &&
     (puVar1 = (this->value).ptr.field_1.value.ptr, puVar1 != (uchar *)0x0)) {
    sVar2 = (this->value).ptr.field_1.value.size_;
    (this->value).ptr.field_1.value.ptr = (uchar *)0x0;
    (this->value).ptr.field_1.value.size_ = 0;
    pAVar3 = (this->value).ptr.field_1.value.disposer;
    (**pAVar3->_vptr_ArrayDisposer)(pAVar3,puVar1,1,sVar2,sVar2,0);
  }
  if ((this->super_ExceptionOrValue).exception.ptr.isSet == true) {
    Exception::~Exception(&(this->super_ExceptionOrValue).exception.ptr.field_1.value);
    return;
  }
  return;
}

Assistant:

ExceptionOr(T&& value): value(kj::mv(value)) {}